

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_utils.cpp
# Opt level: O3

uint8_t * zmq_z85_decode(uint8_t *dest_,char *string_)

{
  byte bVar1;
  char cVar2;
  size_t sVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  
  sVar3 = strlen(string_);
  if ((4 < sVar3) && (sVar3 == (sVar3 / 5) * 5)) {
    cVar2 = *string_;
    if (cVar2 == '\0') {
      return dest_;
    }
    iVar7 = 0;
    uVar8 = 0;
    uVar6 = 0;
    do {
      if ((0x3030303 < uVar6) || (cVar2 < ' ')) goto LAB_001e6018;
      uVar5 = uVar6 * 0x55;
      bVar1 = decoder[(byte)(cVar2 - 0x20)];
      uVar6 = uVar5 + bVar1;
      if ((bVar1 == 0xff) || (CARRY4(uVar5,(uint)bVar1))) goto LAB_001e6018;
      uVar8 = uVar8 + 1;
      if (uVar8 * -0x33333333 < 0x33333334) {
        uVar9 = 0x1000000;
        iVar10 = 0;
        do {
          dest_[(uint)(iVar7 + iVar10)] = (uint8_t)(uVar6 / uVar9);
          uVar9 = uVar9 >> 8;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 4);
        uVar6 = 0;
        iVar7 = iVar7 + 4;
      }
      cVar2 = string_[uVar8];
    } while (cVar2 != '\0');
    if (uVar8 * -0x33333333 < 0x33333334) {
      return dest_;
    }
  }
LAB_001e6018:
  piVar4 = __errno_location();
  *piVar4 = 0x16;
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *zmq_z85_decode (uint8_t *dest_, const char *string_)
{
    unsigned int byte_nbr = 0;
    unsigned int char_nbr = 0;
    uint32_t value = 0;
    size_t src_len = strlen (string_);

    if (src_len < 5 || src_len % 5 != 0)
        goto error_inval;

    while (string_[char_nbr]) {
        //  Accumulate value in base 85
        if (UINT32_MAX / 85 < value) {
            //  Invalid z85 encoding, represented value exceeds 0xffffffff
            goto error_inval;
        }
        value *= 85;
        const uint8_t index = string_[char_nbr++] - 32;
        if (index >= sizeof (decoder)) {
            //  Invalid z85 encoding, character outside range
            goto error_inval;
        }
        const uint32_t summand = decoder[index];
        if (summand == 0xFF || summand > (UINT32_MAX - value)) {
            //  Invalid z85 encoding, invalid character or represented value exceeds 0xffffffff
            goto error_inval;
        }
        value += summand;
        if (char_nbr % 5 == 0) {
            //  Output value in base 256
            unsigned int divisor = 256 * 256 * 256;
            while (divisor) {
                dest_[byte_nbr++] = value / divisor % 256;
                divisor /= 256;
            }
            value = 0;
        }
    }
    if (char_nbr % 5 != 0) {
        goto error_inval;
    }
    assert (byte_nbr == strlen (string_) * 4 / 5);
    return dest_;

error_inval:
    errno = EINVAL;
    return NULL;
}